

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::Sigma<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *sigma)

{
  int64_t iVar1;
  long lVar2;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *fadexpr;
  TPZBaseMatrix *in_RDX;
  int j_1;
  int i_2;
  int i_1;
  int j;
  int i;
  Fad<double> p;
  TPZFMatrix<Fad<double>_> pIdentity;
  TPZFMatrix<Fad<double>_> Du;
  Fad<double> *in_stack_000007e0;
  TPZVec<Fad<double>_> *in_stack_000007e8;
  TStokesAnalytic *in_stack_000007f0;
  Fad<double> *in_stack_fffffffffffffdf8;
  Fad<double> *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  Fad<double> *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe20;
  Fad<double> *in_stack_fffffffffffffe30;
  Fad<double> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar3;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar4;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe80;
  int local_178;
  int local_174;
  TPZBaseMatrix local_138 [4];
  TPZBaseMatrix local_a8 [3];
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffffd0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffffd8;
  TStokesAnalytic *in_stack_ffffffffffffffe0;
  
  TPZBaseMatrix::Rows(in_RDX);
  TPZBaseMatrix::Cols(in_RDX);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  TPZBaseMatrix::Rows(in_RDX);
  TPZBaseMatrix::Cols(in_RDX);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Duxy<Fad<double>>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_174 = 0;
  while( true ) {
    iVar1 = TPZBaseMatrix::Rows(local_a8);
    if (iVar1 <= local_174) break;
    local_178 = 0;
    while( true ) {
      in_stack_fffffffffffffe38 = (Fad<double> *)(long)local_178;
      iVar1 = TPZBaseMatrix::Cols(local_a8);
      if (iVar1 <= (long)in_stack_fffffffffffffe38) break;
      in_stack_fffffffffffffe30 =
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
                      (int64_t)in_stack_fffffffffffffe10);
      Fad<double>::operator*=((Fad<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_178 = local_178 + 1;
    }
    local_174 = local_174 + 1;
  }
  pressure<Fad<double>>(in_stack_000007f0,in_stack_000007e8,in_stack_000007e0);
  iVar4 = 0;
  while( true ) {
    lVar2 = (long)iVar4;
    iVar1 = TPZBaseMatrix::Rows(local_138);
    if (iVar1 <= lVar2) break;
    in_stack_fffffffffffffe20 =
         (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
                    (int64_t)in_stack_fffffffffffffe10);
    Fad<double>::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    iVar4 = iVar4 + 1;
  }
  iVar4 = 0;
  while( true ) {
    fadexpr = (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)(long)iVar4;
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    if (iVar1 <= (long)fadexpr) break;
    iVar3 = 0;
    while( true ) {
      lVar2 = (long)iVar3;
      iVar1 = TPZBaseMatrix::Cols(in_RDX);
      if (iVar1 <= lVar2) break;
      TPZFMatrix<Fad<double>_>::operator()(in_stack_fffffffffffffe20,(int64_t)fadexpr,lVar2);
      in_stack_fffffffffffffe00 =
           TPZFMatrix<Fad<double>_>::operator()(in_stack_fffffffffffffe20,(int64_t)fadexpr,lVar2);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      TPZFMatrix<Fad<double>_>::operator()(in_stack_fffffffffffffe20,(int64_t)fadexpr,lVar2);
      Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffffe20,fadexpr);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe00);
      iVar3 = iVar3 + 1;
    }
    iVar4 = iVar4 + 1;
  }
  Fad<double>::~Fad(in_stack_fffffffffffffe00);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x1ea121b);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x1ea1228);
  return;
}

Assistant:

void TStokesAnalytic::Sigma(const TPZVec<TVar> &x, TPZFMatrix<TVar> &sigma) const
{
    TPZFMatrix<TVar> Du(sigma.Rows(),sigma.Cols()), pIdentity(sigma.Rows(),sigma.Cols());
    TVar p=0.;
    Duxy(x,Du);
    for(int i=0; i<Du.Rows(); i++)
    {
        for(int j=0; j<Du.Cols(); j++)
        {
            Du(i,j) *= 2.*fvisco;
        }
    }
    pressure(x, p);
    for (int i=0; i< pIdentity.Rows(); i++) {
        pIdentity(i,i) = p;
    }
    
    for(int i=0; i<sigma.Rows(); i++)
    {
        for(int j=0; j<sigma.Cols(); j++)
        {
            sigma(i,j) = Du(i,j)-pIdentity(i,j);
        }
    }

}